

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void interpreter(str *program,str *input,ostream *out,ostream *err)

{
  s_i raw;
  bool bVar1;
  bool bVar2;
  encoding_t eVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ostream *this;
  P_Sequence *p;
  int local_30c;
  int local_304;
  bool local_2e9;
  State local_298;
  int local_23c;
  int iStack_238;
  int mr;
  point local_230;
  undefined1 local_228 [8];
  State local;
  Direction *d;
  iterator __end3;
  iterator __begin3;
  vector<Direction,_std::allocator<Direction>_> *__range3;
  int local_1a8;
  int x;
  int y;
  int ymax;
  int xmax;
  int nmatch;
  bool bStack_190;
  undefined7 uStack_18f;
  char *local_188;
  Grid local_180;
  undefined1 local_158 [8];
  State global;
  bool empty;
  parse_exc e;
  P_Sequence *pat;
  s_i body;
  vector<Direction,_std::allocator<Direction>_> local_b8;
  int local_9c;
  undefined1 local_98 [4];
  int c;
  s_i o;
  point local_70;
  undefined1 local_68 [8];
  vector<Direction,_std::allocator<Direction>_> dirs;
  int local_48;
  bool allpaths;
  int iStack_44;
  bool mobile;
  int chfill;
  m_type type;
  m_start start;
  m_just just;
  size_t nl;
  encoding_t progEnc;
  ostream *err_local;
  ostream *out_local;
  str *input_local;
  str *program_local;
  
  eVar3 = detect_encoding(program);
  uVar5 = std::__cxx11::string::find((char)program,10);
  type = M_TYPE_COUNT;
  bVar2 = true;
  iStack_44 = 0;
  local_48 = -0x80000000;
  dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  std::vector<Direction,_std::allocator<Direction>_>::vector
            ((vector<Direction,_std::allocator<Direction>_> *)local_68);
  local_70.x = 1;
  local_70.y = 0;
  std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
            ((vector<Direction,_std::allocator<Direction>_> *)local_68,&local_70);
  if (uVar5 == 0xffffffffffffffff) {
LAB_00116b60:
    s_i::s_i((s_i *)&pat,program,eVar3 == ENC_UTF8,uVar5 + 1);
    p = parse((s_i *)&pat);
    local_2e9 = false;
    if (eVar3 != ENC_SINGLE_BYTE) {
      eVar3 = detect_encoding(input);
      local_2e9 = eVar3 != ENC_SINGLE_BYTE;
    }
    s_i::s_i((s_i *)&xmax,input,local_2e9,0);
    raw.utf8 = bStack_190;
    raw._9_7_ = uStack_18f;
    raw.s = _xmax;
    raw.i = local_188;
    Grid::Grid(&local_180,raw,10,type,local_48,
               (bool *)((long)&global.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
    State::State((State *)local_158,&local_180,
                 (bool)(dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    Grid::~Grid(&local_180);
    if (((global.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) || (iStack_44 != 2)) {
      ymax = 0;
      if (bVar2) {
        local_304 = Grid::bWidth((Grid *)local_158);
        local_30c = Grid::bHeight((Grid *)local_158);
      }
      else {
        local_304 = 1;
        local_30c = 1;
      }
      for (local_1a8 = 0; local_1a8 < local_30c; local_1a8 = local_1a8 + 1) {
        for (__range3._4_4_ = 0; __range3._4_4_ < local_304; __range3._4_4_ = __range3._4_4_ + 1) {
          __end3 = std::vector<Direction,_std::allocator<Direction>_>::begin
                             ((vector<Direction,_std::allocator<Direction>_> *)local_68);
          d = (Direction *)
              std::vector<Direction,_std::allocator<Direction>_>::end
                        ((vector<Direction,_std::allocator<Direction>_> *)local_68);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<Direction_*,_std::vector<Direction,_std::allocator<Direction>_>_>
                                             *)&d), bVar2) {
            local.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)__gnu_cxx::
                          __normal_iterator<Direction_*,_std::vector<Direction,_std::allocator<Direction>_>_>
                          ::operator*(&__end3);
            State::State((State *)local_228,(State *)local_158);
            local_230 = Direction::absdir((Direction *)
                                          local.qcount.super__Vector_base<int,_std::allocator<int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iStack_238 = __range3._4_4_;
            mr = local_1a8;
            local.direction.y = local_1a8;
            local.direction.x = __range3._4_4_;
            local.cg.other.count = (int *)local_230;
            State::State(&local_298,(State *)local_228);
            iVar4 = match(&local_298,p,
                          (bool)(dirs.super__Vector_base<Direction,_std::allocator<Direction>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            State::~State(&local_298);
            local_23c = iVar4;
            if (iVar4 < 1) {
              if (iVar4 == -1) {
                std::operator<<(err,"Stack Overflow\n");
                body.i._4_4_ = 1;
              }
              else {
                if (iStack_44 != 2) goto LAB_00117082;
                std::ostream::operator<<(out,0);
                body.i._4_4_ = 1;
              }
            }
            else if (iStack_44 == 1) {
              std::ostream::operator<<(out,1);
              body.i._4_4_ = 1;
            }
            else {
              ymax = iVar4 + ymax;
LAB_00117082:
              body.i._4_4_ = 0;
            }
            State::~State((State *)local_228);
            if (body.i._4_4_ != 0) goto LAB_0011712a;
            __gnu_cxx::
            __normal_iterator<Direction_*,_std::vector<Direction,_std::allocator<Direction>_>_>::
            operator++(&__end3);
          }
        }
      }
      if (iStack_44 == 2) {
        std::ostream::operator<<(out,1);
      }
      else {
        std::ostream::operator<<(out,ymax);
      }
      body.i._4_4_ = 0;
    }
    else {
      std::ostream::operator<<(out,1);
      body.i._4_4_ = 1;
    }
LAB_0011712a:
    State::~State((State *)local_158);
  }
  else {
    s_i::s_i((s_i *)local_98,program,eVar3 == ENC_UTF8,0);
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          sVar6 = s_i::ind((s_i *)local_98);
                          if (uVar5 <= sVar6) goto LAB_00116b60;
                          local_9c = s_i::get((s_i *)local_98);
                          if (local_9c != 0x3f) break;
                          iStack_44 = 1;
                        }
                        if (local_9c != 0x26) break;
                        iStack_44 = 2;
                      }
                      if (local_9c != 0x52) break;
                      type = M_TYPE_BOOLEAN;
                    }
                    if (local_9c != 0x5e) break;
                    bVar2 = false;
                  }
                  if (local_9c != 0x46) break;
                  local_48 = 0x20;
                }
                if (local_9c != 0x45) break;
                local_48 = s_i::get((s_i *)local_98);
              }
              if (local_9c != 0x4d) break;
              dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            }
            if (local_9c != 0x41) break;
            dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          }
          if ((local_9c != 0x2c) || (iVar4 = s_i::peek((s_i *)local_98,0), iVar4 != 0x2c)) break;
          skip_comment((s_i *)local_98);
        }
        bVar1 = is_dir_inst(local_9c,false);
        if (!bVar1) break;
        s_i::back((s_i *)local_98);
        read_dirs(&local_b8,(s_i *)local_98,false);
        std::vector<Direction,_std::allocator<Direction>_>::operator=
                  ((vector<Direction,_std::allocator<Direction>_> *)local_68,&local_b8);
        std::vector<Direction,_std::allocator<Direction>_>::~vector(&local_b8);
      }
      iVar4 = isspace(local_9c);
    } while (iVar4 != 0);
    this = std::operator<<(err,"Unrecognized option: ");
    std::ostream::operator<<(this,local_9c);
    body.i._4_4_ = 1;
  }
  std::vector<Direction,_std::allocator<Direction>_>::~vector
            ((vector<Direction,_std::allocator<Direction>_> *)local_68);
  return;
}

Assistant:

void interpreter(const str &program, const str &input, std::ostream &out, std::ostream &err) {
    encoding_t progEnc = detect_encoding(program);
    size_t nl = program.find('\n');
    m_just just = M_JUST_LEFT; m_start start = M_START_ALLBOX; m_type type = M_TYPE_COUNT;
    int chfill = OUT_CHAR;
    bool mobile = false, allpaths = false;
    vector<Direction> dirs;
    dirs.emplace_back( point{ 1, 0 } );

    if (~nl) {
        s_i o{ program, progEnc == ENC_UTF8 };
        for (int c; o.ind() < nl; ) {
            c = o.get();
            if (c == INST_OPTION_TYPE_BOOLEAN) type = M_TYPE_BOOLEAN;
            else if (c == INST_OPTION_TYPE_ALL) type = M_TYPE_ALL;
            else if (c == INST_OPTION_RJUST) just = M_JUST_RIGHT;
            else if (c == INST_OPTION_START_TOPLEFT) start = M_START_TOPLEFT;
            else if (c == INST_OPTION_FILL_SPACE) chfill = ' ';
            else if (c == INST_OPTION_FILL_CHAR) chfill = o.get();
            else if (c == INST_OPTION_MOBILE_START) mobile = true;
            else if (c == INST_OPTION_ALL_PATHS) allpaths = true;
            else if (c == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT && o.peek() == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT) skip_comment(o);
            else if (is_dir_inst(c, false)) {
                o.back();
                dirs = read_dirs(o, false);
            } else if (!isspace(c)) {
                err << "Unrecognized option: " << c;
                return;
            }
        }
    }

    s_i body{ program, progEnc == ENC_UTF8, nl + 1 };
    P_Sequence *pat;
    try {
        pat = parse(body);
    } catch (parse_exc e) {
        err << "Parse error: " << e.what();
        if (~e.i) err << " at position " << e.i;
        err << std::endl;
        return;
    }
    bool empty;
    State global(Grid{ s_i{ input, progEnc != ENC_SINGLE_BYTE && detect_encoding(input) != ENC_SINGLE_BYTE },
        '\n', just, chfill, empty }, mobile);
    if (empty && type == M_TYPE_ALL) {
        out << 1;
        return;
    }

    int nmatch = 0;

    int xmax = start == M_START_ALLBOX ? global.cg.bWidth() : 1;
    int ymax = start == M_START_ALLBOX ? global.cg.bHeight() : 1;
    for (int y = 0; y < ymax; y++) {
        for (int x = 0; x < xmax; x++) {
            for (Direction &d : dirs) {
                State local{ global };
                local.direction = d.absdir();
                local.position = { x, y };
                int mr = match(local, pat, allpaths);
                if (mr > 0) {
                    if (type == M_TYPE_BOOLEAN) {
                        out << 1;
                        return;
                    }
                    nmatch += mr;
                } else if (mr == MATCH_RESULT_OVERFLOW) {
                    err << "Stack Overflow\n";
                    return;
                } else if (type == M_TYPE_ALL) {
                    out << 0;
                    return;
                }
            }
        }
    }
    if (type == M_TYPE_ALL) {
        out << 1;
    } else {
        out << nmatch;
    }
}